

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::deinit(BBoxRenderCase *this)

{
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset(&(this->m_vbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&(this->m_fbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
         );
  return;
}

Assistant:

void BBoxRenderCase::deinit (void)
{
	m_program.clear();
	m_vbo.clear();
	m_fbo.clear();
}